

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O1

ssize_t __thiscall DepthBuffer::write(DepthBuffer *this,int __fd,void *__buf,size_t __n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  size_t y;
  undefined4 in_register_00000034;
  size_t x;
  TGAImage image;
  TGAColor local_85;
  char *local_80;
  string local_78;
  TGAImage local_58;
  
  local_80 = (char *)CONCAT44(in_register_00000034,__fd);
  TGAImage::TGAImage(&local_58,this->width,this->height,1);
  if (this->width != 0) {
    lVar2 = 0;
    x = 0;
    do {
      if (this->height != 0) {
        y = 0;
        do {
          local_85.bgra[0] =
               (uint8_t)(int)*(double *)
                              ((long)(this->data).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + y * 8 + this->width * lVar2)
          ;
          local_85.bgra[1] = '\0';
          local_85.bgra[2] = '\0';
          local_85.bgra[3] = '\0';
          local_85.bytespp = '\x01';
          TGAImage::set(&local_58,x,y,&local_85);
          y = y + 1;
        } while (y < this->height);
      }
      x = x + 1;
      lVar2 = lVar2 + 8;
    } while (x < this->width);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,local_80,(allocator<char> *)&local_85);
  TGAImage::write_tga_file(&local_58,&local_78,true,true);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    paVar1 = extraout_RAX;
  }
  if (local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    paVar1 = extraout_RAX_00;
  }
  return (ssize_t)paVar1;
}

Assistant:

void DepthBuffer::write(const char *filename) const
{
    TGAImage image(width, height, TGAImage::GRAYSCALE);
    for (size_t i = 0; i < width; i++) {
        for (size_t j = 0; j < height; j++) {
            image.set(i, j, TGAColor(static_cast<uint8_t>(data[i * width + j])));
        }
    }
    image.write_tga_file(filename);
}